

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

TriggerPrg * getRowTrigger(Parse *pParse,Trigger *pTrigger,Table *pTab,int orconf)

{
  undefined4 uVar1;
  undefined4 uVar2;
  sqlite3 *db;
  sqlite3 *db_00;
  Vdbe *p;
  VdbeOp *pVVar3;
  u8 uVar4;
  int iVar5;
  uint dest;
  TriggerPrg *pTVar6;
  SubProgram *pSVar7;
  Parse *pParse_00;
  Vdbe *pVVar8;
  char *zP4;
  Expr *pEVar9;
  SrcList *pSVar10;
  ExprList *pEVar11;
  IdList *pColumn;
  Select *pSVar12;
  Parse *pPVar13;
  TriggerStep *pStep;
  SelectDest local_78;
  undefined1 local_68 [24];
  undefined1 local_50 [16];
  undefined1 local_40 [16];
  
  pPVar13 = pParse->pToplevel;
  if (pParse->pToplevel == (Parse *)0x0) {
    pPVar13 = pParse;
  }
  pTVar6 = pPVar13->pTriggerPrg;
  while( true ) {
    if (pTVar6 == (TriggerPrg *)0x0) {
      db = pParse->db;
      pTVar6 = (TriggerPrg *)sqlite3DbMallocRaw(db,0x28);
      if (pTVar6 != (TriggerPrg *)0x0) {
        pTVar6->pProgram = (SubProgram *)0x0;
        pTVar6->orconf = 0;
        pTVar6->aColmask[0] = 0;
        pTVar6->pTrigger = (Trigger *)0x0;
        pTVar6->pNext = (TriggerPrg *)0x0;
        *(undefined8 *)(pTVar6->aColmask + 1) = 0;
        pTVar6->pNext = pPVar13->pTriggerPrg;
        pPVar13->pTriggerPrg = pTVar6;
        pSVar7 = (SubProgram *)sqlite3DbMallocRaw(db,0x28);
        if (pSVar7 == (SubProgram *)0x0) {
          pTVar6->pProgram = (SubProgram *)0x0;
        }
        else {
          pSVar7->nCsr = 0;
          pSVar7->nOnce = 0;
          pSVar7->token = (void *)0x0;
          pSVar7->aOp = (VdbeOp *)0x0;
          pSVar7->nOp = 0;
          pSVar7->nMem = 0;
          pSVar7->pNext = (SubProgram *)0x0;
          pTVar6->pProgram = pSVar7;
          pVVar8 = pPVar13->pVdbe;
          pSVar7->pNext = pVVar8->pProgram;
          pVVar8->pProgram = pSVar7;
          pTVar6->pTrigger = pTrigger;
          pTVar6->orconf = orconf;
          pTVar6->aColmask[0] = 0xffffffff;
          pTVar6->aColmask[1] = 0xffffffff;
          pParse_00 = (Parse *)sqlite3DbMallocRaw(db,0x298);
          if (pParse_00 != (Parse *)0x0) {
            dest = 0;
            memset(&pParse_00->zErrMsg,0,0x290);
            local_68._8_16_ = (undefined1  [16])0x0;
            local_50 = (undefined1  [16])0x0;
            local_40 = (undefined1  [16])0x0;
            pParse_00->db = db;
            pParse_00->pTriggerTab = pTab;
            pParse_00->pToplevel = pPVar13;
            pParse_00->zAuthContext = pTrigger->zName;
            pParse_00->eTriggerOp = pTrigger->op;
            pParse_00->nQueryLoop = pParse->nQueryLoop;
            local_68._0_8_ = pParse_00;
            pVVar8 = sqlite3GetVdbe(pParse_00);
            if (pVVar8 != (Vdbe *)0x0) {
              zP4 = sqlite3MPrintf(db,"-- TRIGGER %s",pTrigger->zName);
              sqlite3VdbeChangeP4(pVVar8,-1,zP4,-1);
              if (pTrigger->pWhen != (Expr *)0x0) {
                dest = 0;
                pEVar9 = exprDup(db,pTrigger->pWhen,0,(u8 **)0x0);
                iVar5 = sqlite3ResolveExprNames((NameContext *)local_68,pEVar9);
                if ((iVar5 == 0) && (db->mallocFailed == '\0')) {
                  dest = sqlite3VdbeMakeLabel(pVVar8);
                  sqlite3ExprIfFalse(pParse_00,pEVar9,dest,8);
                }
                sqlite3ExprDelete(db,pEVar9);
              }
              pStep = pTrigger->step_list;
              if (pStep != (TriggerStep *)0x0) {
                db_00 = pParse_00->db;
                p = pParse_00->pVdbe;
                do {
                  uVar4 = (u8)orconf;
                  if (orconf == 99) {
                    uVar4 = pStep->orconf;
                  }
                  pParse_00->eOrconf = uVar4;
                  pParse_00->cookieGoto = 0;
                  uVar4 = pStep->op;
                  if (uVar4 == 'i') {
                    pSVar10 = targetSrcList(pParse_00,pStep);
                    pEVar11 = sqlite3ExprListDup(db_00,pStep->pExprList,0);
                    pSVar12 = sqlite3SelectDup(db_00,pStep->pSelect,0);
                    pColumn = sqlite3IdListDup(db_00,pStep->pIdList);
                    sqlite3Insert(pParse_00,pSVar10,pEVar11,pSVar12,pColumn,(uint)pParse_00->eOrconf
                                 );
                  }
                  else if (uVar4 == 'j') {
                    pSVar10 = targetSrcList(pParse_00,pStep);
                    pEVar9 = exprDup(db_00,pStep->pWhere,0,(u8 **)0x0);
                    sqlite3DeleteFrom(pParse_00,pSVar10,pEVar9);
                  }
                  else if (uVar4 == 'k') {
                    pSVar10 = targetSrcList(pParse_00,pStep);
                    pEVar11 = sqlite3ExprListDup(db_00,pStep->pExprList,0);
                    pEVar9 = exprDup(db_00,pStep->pWhere,0,(u8 **)0x0);
                    sqlite3Update(pParse_00,pSVar10,pEVar11,pEVar9,(uint)pParse_00->eOrconf);
                  }
                  else {
                    pSVar12 = sqlite3SelectDup(db_00,pStep->pSelect,0);
                    local_78.eDest = '\x04';
                    local_78.affSdst = '\0';
                    local_78.iSDParm = 0;
                    local_78.iSdst = 0;
                    local_78.nSdst = 0;
                    sqlite3Select(pParse_00,pSVar12,&local_78);
                    sqlite3SelectDelete(db_00,pSVar12);
                  }
                  if (pStep->op != 't') {
                    sqlite3VdbeAddOp3(p,0x3c,0,0,0);
                  }
                  pStep = pStep->pNext;
                } while (pStep != (TriggerStep *)0x0);
              }
              if ((dest != 0) && (pVVar8->aLabel != (int *)0x0)) {
                pVVar8->aLabel[(int)~dest] = pVVar8->nOp;
              }
              sqlite3VdbeAddOp3(pVVar8,6,0,0,0);
              if (pParse->nErr == 0) {
                pParse->zErrMsg = pParse_00->zErrMsg;
                pParse->nErr = pParse_00->nErr;
              }
              else {
                sqlite3DbFree(pParse_00->db,pParse_00->zErrMsg);
              }
              if (db->mallocFailed == '\0') {
                pVVar3 = pVVar8->aOp;
                resolveP2Values(pVVar8,&pPVar13->nMaxArg);
                pSVar7->nOp = pVVar8->nOp;
                pVVar8->aOp = (Op *)0x0;
                pSVar7->aOp = pVVar3;
              }
              uVar1 = pParse_00->nTab;
              uVar2 = pParse_00->nMem;
              pSVar7->nMem = uVar2;
              pSVar7->nCsr = uVar1;
              pSVar7->nOnce = pParse_00->nOnce;
              pSVar7->token = pTrigger;
              pTVar6->aColmask[0] = pParse_00->oldmask;
              pTVar6->aColmask[1] = pParse_00->newmask;
              sqlite3VdbeDelete(pVVar8);
            }
            sqlite3DbFree(db,pParse_00);
            return pTVar6;
          }
        }
      }
      return (TriggerPrg *)0x0;
    }
    if ((pTVar6->pTrigger == pTrigger) && (pTVar6->orconf == orconf)) break;
    pTVar6 = pTVar6->pNext;
  }
  return pTVar6;
}

Assistant:

static TriggerPrg *getRowTrigger(
  Parse *pParse,       /* Current parse context */
  Trigger *pTrigger,   /* Trigger to code */
  Table *pTab,         /* The table trigger pTrigger is attached to */
  int orconf           /* ON CONFLICT algorithm. */
){
  Parse *pRoot = sqlite3ParseToplevel(pParse);
  TriggerPrg *pPrg;

  assert( pTrigger->zName==0 || pTab==tableOfTrigger(pTrigger) );

  /* It may be that this trigger has already been coded (or is in the
  ** process of being coded). If this is the case, then an entry with
  ** a matching TriggerPrg.pTrigger field will be present somewhere
  ** in the Parse.pTriggerPrg list. Search for such an entry.  */
  for(pPrg=pRoot->pTriggerPrg; 
      pPrg && (pPrg->pTrigger!=pTrigger || pPrg->orconf!=orconf); 
      pPrg=pPrg->pNext
  );

  /* If an existing TriggerPrg could not be located, create a new one. */
  if( !pPrg ){
    pPrg = codeRowTrigger(pParse, pTrigger, pTab, orconf);
  }

  return pPrg;
}